

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall
FIX::Session::generateResendRequest(Session *this,BeginString *beginString,MsgSeqNum *msgSeqNum)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Message *message;
  signed_int value;
  signed_int value_00;
  string *__lhs;
  STRING local_1d0;
  FieldBase local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  BeginSeqNo beginSeqNo;
  EndSeqNo endSeqNo;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&beginSeqNo,"2",(allocator<char> *)&endSeqNo);
  message = newMessage(this,(string *)&beginSeqNo);
  std::__cxx11::string::~string((string *)&beginSeqNo);
  endSeqNo.super_SeqNumField.super_FieldBase._vptr_FieldBase._0_4_ =
       SessionState::getNextTargetMsgSeqNum(&this->m_state);
  BeginSeqNo::BeginSeqNo(&beginSeqNo,(SEQNUM *)&endSeqNo);
  local_1b0._vptr_FieldBase._0_4_ = IntField::getValue(&msgSeqNum->super_SeqNumField);
  local_1b0._vptr_FieldBase._0_4_ = (int)local_1b0._vptr_FieldBase + -1;
  EndSeqNo::EndSeqNo(&endSeqNo,(SEQNUM *)&local_1b0);
  __lhs = &(beginString->super_StringField).super_FieldBase.m_string;
  bVar1 = std::operator>=(__lhs,"FIX.4.2");
  if (bVar1) {
    local_1d0._M_dataplus._M_p._0_4_ = 0;
    EndSeqNo::EndSeqNo((EndSeqNo *)&local_1b0,(SEQNUM *)&local_1d0);
    FieldBase::operator=((FieldBase *)&endSeqNo,&local_1b0);
  }
  else {
    bVar1 = std::operator<=(__lhs,"FIX.4.1");
    if (!bVar1) goto LAB_001a757f;
    local_1d0._M_dataplus._M_p._0_4_ = 999999;
    EndSeqNo::EndSeqNo((EndSeqNo *)&local_1b0,(SEQNUM *)&local_1d0);
    FieldBase::operator=((FieldBase *)&endSeqNo,&local_1b0);
  }
  FieldBase::~FieldBase(&local_1b0);
LAB_001a757f:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"2",(allocator<char> *)&local_150);
  MsgType::MsgType((MsgType *)&local_1b0,&local_1d0);
  FieldMap::setField(&(message->m_header).super_FieldMap,&local_1b0,true);
  FieldBase::~FieldBase(&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  FieldMap::setField(&message->super_FieldMap,(FieldBase *)&beginSeqNo,true);
  FieldMap::setField(&message->super_FieldMap,(FieldBase *)&endSeqNo,true);
  fill(this,&message->m_header);
  sendRaw(this,message,0);
  uVar2 = IntField::getValue(&beginSeqNo.super_SeqNumField);
  IntConvertor::convert_abi_cxx11_(&local_110,(IntConvertor *)(ulong)uVar2,value);
  std::operator+(&local_150,"Sent ResendRequest FROM: ",&local_110);
  std::operator+(&local_1d0,&local_150," TO: ");
  uVar2 = IntField::getValue(&endSeqNo.super_SeqNumField);
  IntConvertor::convert_abi_cxx11_(&local_130,(IntConvertor *)(ulong)uVar2,value_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                 &local_1d0,&local_130);
  SessionState::onEvent(&this->m_state,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_110);
  iVar3 = IntField::getValue(&beginSeqNo.super_SeqNumField);
  iVar4 = IntField::getValue(&msgSeqNum->super_SeqNumField);
  (this->m_state).m_resendRange.first = iVar3;
  (this->m_state).m_resendRange.second = iVar4 + -1;
  FieldBase::~FieldBase((FieldBase *)&endSeqNo);
  FieldBase::~FieldBase((FieldBase *)&beginSeqNo);
  (*(message->super_FieldMap)._vptr_FieldMap[1])(message);
  return;
}

Assistant:

void Session::generateResendRequest( const BeginString& beginString, const MsgSeqNum& msgSeqNum )
{
  SmartPtr<Message> pMsg(newMessage("2"));
  Message & resendRequest = *pMsg;

  BeginSeqNo beginSeqNo( ( int ) getExpectedTargetNum() );
  EndSeqNo endSeqNo( msgSeqNum - 1 );
  if ( beginString >= FIX::BeginString_FIX42 )
    endSeqNo = 0;
  else if( beginString <= FIX::BeginString_FIX41 )
    endSeqNo = 999999;
  resendRequest.getHeader().setField( MsgType( "2" ) );
  resendRequest.setField( beginSeqNo );
  resendRequest.setField( endSeqNo );
  fill( resendRequest.getHeader() );
  sendRaw( resendRequest );

  m_state.onEvent( "Sent ResendRequest FROM: "
                   + IntConvertor::convert( beginSeqNo ) +
                   " TO: " + IntConvertor::convert( endSeqNo ) );

  m_state.resendRange( beginSeqNo, msgSeqNum - 1 );
}